

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O2

bool __thiscall
TPZAutoPointer<TPZDohrAssembleList<std::complex<double>_>_>::TPZReference::Decrease
          (TPZReference *this)

{
  atomic_int *paVar1;
  int iVar2;
  logic_error *this_00;
  
  LOCK();
  paVar1 = &this->fCounter;
  iVar2 = (paVar1->super___atomic_base<int>)._M_i;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
  UNLOCK();
  if (0 < iVar2) {
    return iVar2 == 1;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Invalid value for ref counter of TPZAutoPointer");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

bool Decrease()
        {
            bool should_delete = false;
            int result = fCounter.fetch_sub(1);
            result--;
//            std::this_thread::sleep_for(std::chrono::milliseconds(10));
            // at this point the object may already have been deleted by another thread
//            {
//                const std::lock_guard<std::mutex> lock(pzinternal::g_diag_mut);
//                std::cout <<  "thread id " <<  std::this_thread::get_id() <<
//                " result " << result << std::endl;
//            }
            if((result) == 0) should_delete = true;
            else if((result) < 0){
                throw std::logic_error(
                    "Invalid value for ref counter of TPZAutoPointer");
            }
            return should_delete;
        }